

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     resize_if_allowed<Eigen::Matrix<int,4,1,0,4,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<int,int>,Eigen::Matrix<int,4,1,0,4,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,Eigen::Matrix<int,4,1,0,4,1>const>const>,int,int>
               (Matrix<int,_4,_1,_0,_4,_1> *dst,
               CwiseBinaryOp<Eigen::internal::scalar_quotient_op<int,_int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>_>_>
               *src,assign_op<int,_int> *param_3)

{
  Index IVar1;
  Index cols;
  Index IVar2;
  bool bVar3;
  Index dstCols;
  Index dstRows;
  assign_op<int,_int> *param_2_local;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<int,_int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>_>_>
  *src_local;
  Matrix<int,_4,_1,_0,_4,_1> *dst_local;
  
  IVar1 = CwiseBinaryOp<Eigen::internal::scalar_quotient_op<int,_int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>_>_>
          ::rows(src);
  cols = CwiseBinaryOp<Eigen::internal::scalar_quotient_op<int,_int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>_>_>
         ::cols(src);
  IVar2 = PlainObjectBase<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>::rows
                    (&dst->super_PlainObjectBase<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>);
  if (IVar2 == IVar1) {
    IVar2 = PlainObjectBase<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>::cols
                      (&dst->super_PlainObjectBase<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>);
    if (IVar2 == cols) goto LAB_0025765d;
  }
  PlainObjectBase<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>::resize
            (&dst->super_PlainObjectBase<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>,IVar1,cols);
LAB_0025765d:
  IVar2 = PlainObjectBase<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>::rows
                    (&dst->super_PlainObjectBase<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>);
  bVar3 = false;
  if (IVar2 == IVar1) {
    IVar1 = PlainObjectBase<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>::cols
                      (&dst->super_PlainObjectBase<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>);
    bVar3 = IVar1 == cols;
  }
  if (!bVar3) {
    __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/AssignEvaluator.h"
                  ,0x2fd,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<int, 4, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<int>, const Eigen::Matrix<int, 4, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>, const Eigen::Matrix<int, 4, 1>>>, T1 = int, T2 = int]"
                 );
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
void resize_if_allowed(DstXprType &dst, const SrcXprType& src, const internal::assign_op<T1,T2> &/*func*/)
{
  Index dstRows = src.rows();
  Index dstCols = src.cols();
  if(((dst.rows()!=dstRows) || (dst.cols()!=dstCols)))
    dst.resize(dstRows, dstCols);
  eigen_assert(dst.rows() == dstRows && dst.cols() == dstCols);
}